

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::get(MutableCodePointTrie *this,UChar32 c)

{
  int iVar1;
  int32_t i;
  UChar32 c_local;
  MutableCodePointTrie *this_local;
  
  if ((uint)c < 0x110000) {
    if (c < this->highStart) {
      iVar1 = c >> 4;
      if (this->flags[iVar1] == '\0') {
        this_local._4_4_ = this->index[iVar1];
      }
      else {
        this_local._4_4_ = this->data[this->index[iVar1] + (c & 0xfU)];
      }
    }
    else {
      this_local._4_4_ = this->highValue;
    }
  }
  else {
    this_local._4_4_ = this->errorValue;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t MutableCodePointTrie::get(UChar32 c) const {
    if ((uint32_t)c > MAX_UNICODE) {
        return errorValue;
    }
    if (c >= highStart) {
        return highValue;
    }
    int32_t i = c >> UCPTRIE_SHIFT_3;
    if (flags[i] == ALL_SAME) {
        return index[i];
    } else {
        return data[index[i] + (c & UCPTRIE_SMALL_DATA_MASK)];
    }
}